

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::insert_heap
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint node_index)

{
  uint uVar1;
  vector<unsigned_int> *this_00;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  vq_node *pvVar6;
  
  pvVar6 = (this->m_nodes).m_p;
  fVar2 = pvVar6[node_index].m_variance;
  uVar3 = this->m_heap_size;
  uVar1 = uVar3 + 1;
  this->m_heap_size = uVar1;
  this_00 = &this->m_heap;
  if ((this->m_heap).m_size <= uVar1) {
    vector<unsigned_int>::resize(this_00,uVar3 + 2,false);
    pvVar6 = (this->m_nodes).m_p;
  }
  puVar5 = this_00->m_p;
  while (1 < uVar1) {
    uVar4 = puVar5[uVar1 >> 1];
    if (fVar2 < pvVar6[uVar4].m_variance) break;
    puVar5[uVar1] = uVar4;
    uVar1 = uVar1 >> 1;
  }
  this_00->m_p[uVar1] = node_index;
  return;
}

Assistant:

void insert_heap(uint node_index)
        {
            const float variance = m_nodes[node_index].m_variance;
            uint pos = ++m_heap_size;

            if (m_heap_size >= m_heap.size())
            {
                m_heap.resize(m_heap_size + 1);
            }

            for (;;)
            {
                uint parent = pos >> 1;
                if (!parent)
                {
                    break;
                }

                float parent_variance = m_nodes[m_heap[parent]].m_variance;
                if (parent_variance > variance)
                {
                    break;
                }

                m_heap[pos] = m_heap[parent];

                pos = parent;
            }

            m_heap[pos] = node_index;
        }